

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

CPAccessResult aa64_daif_access(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  int iVar1;
  uint64_t uVar2;
  
  iVar1 = arm_current_el(env);
  if ((iVar1 == 0) && (uVar2 = arm_sctlr_aarch64(env,0), ((uint)uVar2 >> 9 & 1) == 0)) {
    return CP_ACCESS_TRAP;
  }
  return CP_ACCESS_OK;
}

Assistant:

static CPAccessResult aa64_daif_access(CPUARMState *env, const ARMCPRegInfo *ri,
                                       bool isread)
{
    if (arm_current_el(env) == 0 && !(arm_sctlr(env, 0) & SCTLR_UMA)) {
        return CP_ACCESS_TRAP;
    }
    return CP_ACCESS_OK;
}